

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  QLatin1String *pQVar1;
  long lVar2;
  QChar *pQVar3;
  long lVar4;
  char16_t *pcVar5;
  
  lVar2 = (p->a).a.a.a.d.size;
  if (lVar2 != 0) {
    pcVar5 = (p->a).a.a.a.d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar5,lVar2 * 2);
  }
  pQVar3 = *out;
  *out = pQVar3 + lVar2;
  pQVar1 = &(p->a).a.a.b;
  lVar4 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar3 + lVar2);
  pQVar3 = *out;
  *out = pQVar3 + lVar4;
  lVar2 = (p->a).a.b.d.size;
  if (lVar2 != 0) {
    pcVar5 = (p->a).a.b.d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar3 + lVar4,pcVar5,lVar2 * 2);
  }
  pQVar3 = *out;
  *out = pQVar3 + lVar2;
  pQVar1 = &(p->a).b;
  lVar4 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar3 + lVar2);
  pQVar3 = *out;
  *out = pQVar3 + lVar4;
  lVar2 = (p->b).d.size;
  if (lVar2 != 0) {
    pcVar5 = (p->b).d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar3 + lVar4,pcVar5,lVar2 * 2);
  }
  *out = *out + lVar2;
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }